

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write.c
# Opt level: O2

int archive_write_client_open(archive_write_filter *f)

{
  archive *_a;
  int iVar1;
  int iVar2;
  size_t *__ptr;
  void *__ptr_00;
  size_t __size;
  
  _a = f->archive;
  iVar1 = archive_write_get_bytes_per_block(_a);
  f->bytes_per_block = iVar1;
  iVar1 = archive_write_get_bytes_in_last_block(f->archive);
  f->bytes_in_last_block = iVar1;
  __size = (size_t)f->bytes_per_block;
  __ptr = (size_t *)calloc(1,0x20);
  __ptr_00 = malloc(__size);
  if (__ptr == (size_t *)0x0 || __ptr_00 == (void *)0x0) {
    free(__ptr);
    free(__ptr_00);
    archive_set_error(f->archive,0xc,"Can\'t allocate data for output buffering");
    iVar1 = -0x1e;
  }
  else {
    *__ptr = __size;
    __ptr[2] = (size_t)__ptr_00;
    __ptr[3] = (size_t)__ptr_00;
    __ptr[1] = __size;
    f->data = __ptr;
    iVar1 = 0;
    if ((code *)_a[1].error != (code *)0x0) {
      iVar2 = (*(code *)_a[1].error)(f->archive,_a[1].current_code);
      iVar1 = 0;
      if (iVar2 != 0) {
        free((void *)__ptr[2]);
        free(__ptr);
        f->data = (void *)0x0;
        iVar1 = iVar2;
      }
    }
  }
  return iVar1;
}

Assistant:

static int
archive_write_client_open(struct archive_write_filter *f)
{
	struct archive_write *a = (struct archive_write *)f->archive;
	struct archive_none *state;
	void *buffer;
	size_t buffer_size;
	int ret;

	f->bytes_per_block = archive_write_get_bytes_per_block(f->archive);
	f->bytes_in_last_block =
	    archive_write_get_bytes_in_last_block(f->archive);
	buffer_size = f->bytes_per_block;

	state = calloc(1, sizeof(*state));
	buffer = malloc(buffer_size);
	if (state == NULL || buffer == NULL) {
		free(state);
		free(buffer);
		archive_set_error(f->archive, ENOMEM,
		    "Can't allocate data for output buffering");
		return (ARCHIVE_FATAL);
	}

	state->buffer_size = buffer_size;
	state->buffer = buffer;
	state->next = state->buffer;
	state->avail = state->buffer_size;
	f->data = state;

	if (a->client_opener == NULL)
		return (ARCHIVE_OK);
	ret = a->client_opener(f->archive, a->client_data);
	if (ret != ARCHIVE_OK) {
		free(state->buffer);
		free(state);
		f->data = NULL;
	}
	return (ret);
}